

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlcdnumber.cpp
# Opt level: O0

void __thiscall QLCDNumber::setSegmentStyle(QLCDNumber *this,SegmentStyle s)

{
  QLCDNumberPrivate *pQVar1;
  uint in_ESI;
  QLCDNumberPrivate *d;
  QWidget *in_stack_ffffffffffffffc8;
  bool local_29;
  bool local_19;
  
  pQVar1 = d_func((QLCDNumber *)0x5b9d10);
  local_19 = in_ESI == 2 || in_ESI == 1;
  pQVar1->field_0x288 = pQVar1->field_0x288 & 0xf7 | local_19 << 3;
  local_29 = in_ESI < 2;
  pQVar1->field_0x288 = pQVar1->field_0x288 & 0xef | local_29 << 4;
  QWidget::update(in_stack_ffffffffffffffc8);
  return;
}

Assistant:

void QLCDNumber::setSegmentStyle(SegmentStyle s)
{
    Q_D(QLCDNumber);
    d->fill = (s == Flat || s == Filled);
    d->shadow = (s == Outline || s == Filled);
    update();
}